

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketInitiator.cpp
# Opt level: O0

void __thiscall FIX::SocketInitiator::onConnect(SocketInitiator *this)

{
  socket_handle in_EDX;
  SocketConnector *in_RSI;
  
  onConnect((SocketInitiator *)&this[-1].m_settings.m_defaults,in_RSI,in_EDX);
  return;
}

Assistant:

void SocketInitiator::onConnect(SocketConnector &, socket_handle s) {
  SocketConnections::iterator i = m_pendingConnections.find(s);
  if (i == m_pendingConnections.end()) {
    return;
  }
  SocketConnection *pSocketConnection = i->second;

  m_connections[s] = pSocketConnection;
  m_pendingConnections.erase(i);
  setConnected(pSocketConnection->getSession()->getSessionID());
  pSocketConnection->onTimeout();
}